

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

BOOL is_child_scope(JSContext *ctx,JSFunctionDef *fd,int scope,int parent_scope)

{
  while( true ) {
    if ((int)fd < 0) {
      return 0;
    }
    if ((int)fd == scope) break;
    fd = (JSFunctionDef *)
         (ulong)*(uint *)(ctx->native_error_proto[5].tag + ((ulong)fd & 0xffffffff) * 8);
  }
  return 1;
}

Assistant:

static BOOL is_child_scope(JSContext *ctx, JSFunctionDef *fd,
                           int scope, int parent_scope)
{
    while (scope >= 0) {
        if (scope == parent_scope)
            return TRUE;
        scope = fd->scopes[scope].parent;
    }
    return FALSE;
}